

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O3

void * __thiscall asmjit::ZoneHeap::_alloc(ZoneHeap *this,size_t size,size_t *allocatedSize)

{
  DynamicBlock *pDVar1;
  DynamicBlock *pDVar2;
  Slot *pSVar3;
  Slot *extraout_RAX;
  void *pvVar4;
  int iVar5;
  Slot *pSVar6;
  size_t *unaff_RBX;
  uint uVar7;
  Slot *size_00;
  Zone *this_00;
  Slot *pSVar8;
  uint uVar9;
  
  this_00 = this->_zone;
  if (this_00 == (Zone *)0x0) {
    _alloc();
LAB_00173e5e:
    _alloc();
  }
  else {
    if (size == 0) goto LAB_00173e5e;
    if (size < 0x201) {
      if (size < 0x81) {
        uVar7 = 0x1e0;
        iVar5 = 0x1f;
        uVar9 = (uint)(size + 0x1fffffffff >> 5);
      }
      else {
        uVar7 = 0x7c0;
        iVar5 = 0x3f;
        uVar9 = (int)(size + 0x3fffffff7f >> 6) + 4;
      }
      size_00 = (Slot *)(ulong)(uVar7 & iVar5 + (int)size);
      *allocatedSize = (size_t)size_00;
      pSVar8 = this->_slots[uVar9];
      if (pSVar8 != (Slot *)0x0) {
        this->_slots[uVar9] = pSVar8->next;
        return pSVar8;
      }
      pSVar8 = (Slot *)this_00->_end;
      pSVar3 = (Slot *)((ulong)((long)&((Slot *)this_00->_ptr)[3].next + 7U) & 0xffffffffffffffe0);
      pSVar6 = (Slot *)((long)pSVar8 - (long)pSVar3);
      if (pSVar8 < pSVar3) {
        if (size_00 != (Slot *)0x0) goto LAB_00173ec0;
LAB_00173e43:
        size_00 = (Slot *)((long)&size_00->next + (long)&pSVar3->next);
        if (((Slot *)this_00->_ptr <= size_00) && (size_00 <= pSVar8)) {
          this_00->_ptr = (uint8_t *)size_00;
          return pSVar3;
        }
        _alloc();
        pSVar3 = extraout_RAX;
      }
      else if (size_00 <= pSVar6) goto LAB_00173e43;
      if ((Slot *)0x1f < pSVar6) {
        do {
          pSVar8 = (Slot *)0x80;
          if (pSVar6 < (Slot *)0x80) {
            pSVar8 = pSVar6;
          }
          pSVar6 = (Slot *)((long)pSVar6 - (long)pSVar8);
          uVar9 = (int)pSVar8 + 0x60U >> 5 & 3;
          pSVar3->next = this->_slots[uVar9];
          this->_slots[uVar9] = pSVar3;
          pSVar3 = (Slot *)((long)&pSVar3->next + (long)&pSVar8->next);
        } while ((Slot *)0x1f < pSVar6);
        if ((pSVar3 < (Slot *)this_00->_ptr) || ((Slot *)this_00->_end < pSVar3)) {
          _alloc();
        }
        this_00->_ptr = (uint8_t *)pSVar3;
      }
LAB_00173ec0:
      pvVar4 = Zone::_alloc(this_00,(size_t)size_00);
      if (pvVar4 == (void *)0x0) {
        *allocatedSize = 0;
        return (void *)0x0;
      }
      return pvVar4;
    }
    if (0xffffffffffffffc6 < size) {
      return (void *)0x0;
    }
    pDVar2 = (DynamicBlock *)malloc(size + 0x38);
    unaff_RBX = allocatedSize;
    if (pDVar2 != (DynamicBlock *)0x0) {
      pDVar1 = this->_dynamicBlocks;
      if (pDVar1 != (DynamicBlock *)0x0) {
        pDVar1->prev = pDVar2;
      }
      pDVar2->prev = (DynamicBlock *)0x0;
      pDVar2->next = pDVar1;
      this->_dynamicBlocks = pDVar2;
      pvVar4 = (void *)((ulong)((long)&pDVar2[3].prev + 7U) & 0xffffffffffffffe0);
      *(DynamicBlock **)((long)pvVar4 - 8) = pDVar2;
      goto LAB_00173ddb;
    }
  }
  size = 0;
  pvVar4 = (void *)0x0;
LAB_00173ddb:
  *unaff_RBX = size;
  return pvVar4;
}

Assistant:

void* ZoneHeap::_alloc(size_t size, size_t& allocatedSize) noexcept {
  ASMJIT_ASSERT(isInitialized());

  // We use our memory pool only if the requested block is of a reasonable size.
  uint32_t slot;
  if (_getSlotIndex(size, slot, allocatedSize)) {
    // Slot reuse.
    uint8_t* p = reinterpret_cast<uint8_t*>(_slots[slot]);
    size = allocatedSize;

    if (p) {
      _slots[slot] = reinterpret_cast<Slot*>(p)->next;
      //printf("ALLOCATED %p of size %d (SLOT %d)\n", p, int(size), slot);
      return p;
    }

    // So use Zone to allocate a new chunk for us. But before we use it, we
    // check if there is enough room for the new chunk in zone, and if not,
    // we redistribute the remaining memory in Zone's current block into slots.
    Zone* zone = _zone;
    p = Utils::alignTo(zone->getCursor(), kBlockAlignment);
    size_t remain = (p <= zone->getEnd()) ? (size_t)(zone->getEnd() - p) : size_t(0);

    if (ASMJIT_LIKELY(remain >= size)) {
      zone->setCursor(p + size);
      //printf("ALLOCATED %p of size %d (SLOT %d)\n", p, int(size), slot);
      return p;
    }
    else {
      // Distribute the remaining memory to suitable slots.
      if (remain >= kLoGranularity) {
        do {
          size_t distSize = std::min<size_t>(remain, kLoMaxSize);
          uint32_t distSlot = static_cast<uint32_t>((distSize - kLoGranularity) / kLoGranularity);
          ASMJIT_ASSERT(distSlot < kLoCount);

          reinterpret_cast<Slot*>(p)->next = _slots[distSlot];
          _slots[distSlot] = reinterpret_cast<Slot*>(p);

          p += distSize;
          remain -= distSize;
        } while (remain >= kLoGranularity);
        zone->setCursor(p);
      }

      p = static_cast<uint8_t*>(zone->_alloc(size));
      if (ASMJIT_UNLIKELY(!p)) {
        allocatedSize = 0;
        return nullptr;
      }

      //printf("ALLOCATED %p of size %d (SLOT %d)\n", p, int(size), slot);
      return p;
    }
  }
  else {
    // Allocate a dynamic block.
    size_t overhead = sizeof(DynamicBlock) + sizeof(DynamicBlock*) + kBlockAlignment;

    // Handle a possible overflow.
    if (ASMJIT_UNLIKELY(overhead >= ~static_cast<size_t>(0) - size))
      return nullptr;

    void* p = Internal::allocMemory(size + overhead);
    if (ASMJIT_UNLIKELY(!p)) {
      allocatedSize = 0;
      return nullptr;
    }

    // Link as first in `_dynamicBlocks` double-linked list.
    DynamicBlock* block = static_cast<DynamicBlock*>(p);
    DynamicBlock* next = _dynamicBlocks;

    if (next)
      next->prev = block;

    block->prev = nullptr;
    block->next = next;
    _dynamicBlocks = block;

    // Align the pointer to the guaranteed alignment and store `DynamicBlock`
    // at the end of the memory block, so `_releaseDynamic()` can find it.
    p = Utils::alignTo(static_cast<uint8_t*>(p) + sizeof(DynamicBlock) + sizeof(DynamicBlock*), kBlockAlignment);
    reinterpret_cast<DynamicBlock**>(p)[-1] = block;

    allocatedSize = size;
    //printf("ALLOCATED DYNAMIC %p of size %d\n", p, int(size));
    return p;
  }
}